

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O2

void __thiscall ArrayType::ArrayType(ArrayType *this,Type *type,uint size)

{
  (this->super_Type).kind = TK_ArrayType;
  (this->super_Type).isConst = false;
  (this->super_Type)._vptr_Type = (_func_int **)&PTR__ArrayType_00198888;
  this->type = type;
  this->size = size;
  (this->structName)._M_dataplus._M_p = (pointer)&(this->structName).field_2;
  (this->structName)._M_string_length = 0;
  (this->structName).field_2._M_local_buf[0] = '\0';
  this->isStructArray = false;
  this->isPointerArray = false;
  if (type != (Type *)0x0) {
    if (type->kind == TK_ArrayType) {
      this->isStructArray = type[1].isConst;
      std::__cxx11::string::_M_assign((string *)&this->structName);
      this->isPointerArray = *(bool *)&type[4]._vptr_Type;
      this->pointer = *(PointerType **)&type[4].kind;
      type = this->type;
      if ((PointerType *)type == (PointerType *)0x0) {
        return;
      }
    }
    if ((((PointerType *)type)->super_Type).kind == TK_StructType) {
      this->isStructArray = true;
      std::__cxx11::string::_M_assign((string *)&this->structName);
      type = this->type;
      if ((PointerType *)type == (PointerType *)0x0) {
        return;
      }
    }
    if ((((PointerType *)type)->super_Type).kind == TK_PointerType) {
      this->isPointerArray = true;
      this->pointer = (PointerType *)type;
    }
  }
  return;
}

Assistant:

AggregateType::AggregateType(TypeKind kind, const std::string& name): Type(kind), name(name) { }